

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

int __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::remove
          (QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
           *this,char *__filename)

{
  long in_FS_OFFSET;
  QWriteLocker locker;
  pair<int,_int> k;
  QReadWriteLock *in_stack_ffffffffffffffa8;
  QWriteLocker *this_00;
  pair<int,_int> local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (int)__filename;
  this_00 = (QWriteLocker *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_18,&local_c,&local_10);
  QWriteLocker::QWriteLocker(this_00,in_stack_ffffffffffffffa8);
  QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::remove
            ((QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)(this + 8),
             (char *)&local_18);
  QWriteLocker::~QWriteLocker((QWriteLocker *)0x3a6cb2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void remove(int from, int to)
    {
        const Key k(from, to);
        const QWriteLocker locker(&lock);
        map.remove(k);
    }